

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

bool __thiscall pbrt::Integrator::IntersectP(Integrator *this,Ray *ray,Float tMax)

{
  bool bVar1;
  long in_FS_OFFSET;
  
  *(long *)(in_FS_OFFSET + -0x2a8) = *(long *)(in_FS_OFFSET + -0x2a8) + 1;
  if (((this->aggregate).
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       .bits & 0xffffffffffff) != 0) {
    bVar1 = PrimitiveHandle::IntersectP(&this->aggregate,ray,tMax);
    return bVar1;
  }
  return false;
}

Assistant:

bool Integrator::IntersectP(const Ray &ray, Float tMax) const {
    ++nShadowTests;
    DCHECK_NE(ray.d, Vector3f(0, 0, 0));
    if (aggregate)
        return aggregate.IntersectP(ray, tMax);
    else
        return false;
}